

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O1

void HTS_Engine_save_generated_parameter(HTS_Engine *engine,size_t stream_index,FILE *fp)

{
  undefined8 in_RAX;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  HTS_GStreamSet *gss;
  double dVar4;
  float temp;
  undefined8 uStack_38;
  
  gss = &engine->gss;
  uStack_38 = in_RAX;
  sVar1 = HTS_GStreamSet_get_total_frame(gss);
  if (sVar1 != 0) {
    sVar1 = 0;
    do {
      sVar2 = HTS_GStreamSet_get_vector_length(gss,stream_index);
      if (sVar2 != 0) {
        sVar2 = 0;
        do {
          dVar4 = HTS_GStreamSet_get_parameter(gss,stream_index,sVar1,sVar2);
          uStack_38 = CONCAT44((float)dVar4,(undefined4)uStack_38);
          fwrite((void *)((long)&uStack_38 + 4),4,1,(FILE *)fp);
          sVar2 = sVar2 + 1;
          sVar3 = HTS_GStreamSet_get_vector_length(gss,stream_index);
        } while (sVar2 < sVar3);
      }
      sVar1 = sVar1 + 1;
      sVar2 = HTS_GStreamSet_get_total_frame(gss);
    } while (sVar1 < sVar2);
  }
  return;
}

Assistant:

void HTS_Engine_save_generated_parameter(HTS_Engine * engine, size_t stream_index, FILE * fp)
{
   size_t i, j;
   float temp;
   HTS_GStreamSet *gss = &engine->gss;

   for (i = 0; i < HTS_GStreamSet_get_total_frame(gss); i++)
      for (j = 0; j < HTS_GStreamSet_get_vector_length(gss, stream_index); j++) {
         temp = (float) HTS_GStreamSet_get_parameter(gss, stream_index, i, j);
         fwrite(&temp, sizeof(float), 1, fp);
      }
}